

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithInit(Gia_Man_t *p)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar18 = 1;
    lVar15 = 0x14;
    do {
      pGVar2 = p->pObjs;
      uVar9 = *(ulong *)((long)pGVar2 + lVar15 + -8);
      uVar19 = (uint)uVar9;
      iVar4 = (int)(uVar9 & 0x1fffffff);
      if ((uVar9 & 0x1fffffff) == 0x1fffffff || (int)uVar19 < 0) {
        if ((uVar19 & 0x9fffffff) == 0x9fffffff) {
          pGVar8 = Gia_ManAppendObj(p_00);
          uVar9 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 = uVar9 | 0x9fffffff;
          *(ulong *)pGVar8 =
               uVar9 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar7 = p_00->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar8)) {
LAB_00506f99:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * -0x55555555);
          pGVar7 = p_00->pObjs;
          if ((pGVar8 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar8)) goto LAB_00506f99;
          uVar19 = (int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * 0x55555556;
          *(uint *)(&pGVar2->field_0x0 + lVar15) = uVar19;
          if ((int)uVar19 < 0) goto LAB_00506fb8;
          *(uint *)(&pGVar2->field_0x0 + lVar15) =
               *(uint *)((long)pGVar2 + lVar15 + -8) >> 0x1e & 1 | uVar19;
        }
        else if ((int)uVar19 < 0 && iVar4 != 0x1fffffff) {
          uVar14 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uint)(iVar4 << 2) * -3);
          if ((int)uVar14 < 0) goto LAB_00506fb8;
          uVar14 = (uVar19 >> 0x1e ^ (uint)(uVar9 >> 0x1d) & 7) & 1 ^ uVar14;
          *(uint *)(&pGVar2->field_0x0 + lVar15) = uVar14;
          iVar4 = Gia_ManAppendCo(p_00,uVar14);
          *(int *)(&pGVar2->field_0x0 + lVar15) = iVar4;
        }
      }
      else {
        uVar19 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uint)(iVar4 << 2) * -3);
        if ((int)uVar19 < 0) {
LAB_00506fb8:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar14 = *(uint *)((long)pGVar2 + lVar15 + (ulong)((uint)(uVar9 >> 0x1e) & 0x7ffffffc) * -3)
        ;
        if ((int)uVar14 < 0) goto LAB_00506fb8;
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar10 = uVar19 >> 1;
        iVar4 = p_00->nObjs;
        if (iVar4 <= (int)uVar10) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x267,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar3 = uVar14 >> 1;
        if (iVar4 <= (int)uVar3) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x268,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if (uVar10 == uVar3) {
          __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x269,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar19 = uVar19 ^ (uint)(uVar9 >> 0x1d) & 1;
        uVar14 = uVar14 ^ (uint)(uVar9 >> 0x3d) & 1;
        iVar13 = (int)pGVar7;
        if ((int)uVar19 < (int)uVar14) {
          pGVar8 = p_00->pObjs;
          if ((pGVar7 < pGVar8) || (pGVar8 + iVar4 <= pGVar7)) goto LAB_00506f99;
          uVar9 = *(ulong *)pGVar7;
          uVar12 = (ulong)((uVar19 & 1) << 0x1d |
                          ((uint)(iVar13 - (int)pGVar8) >> 2) * -0x55555555 - uVar10 & 0x1fffffff);
          *(ulong *)pGVar7 = uVar12 | uVar9 & 0xffffffffc0000000;
          pGVar8 = p_00->pObjs;
          if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_00506f99;
          uVar11 = (ulong)(((uint)(iVar13 - (int)pGVar8) >> 2) * -0x55555555 - uVar3 & 0x1fffffff)
                   << 0x20;
          *(ulong *)pGVar7 = uVar12 | uVar9 & 0xe0000000c0000000 | uVar11;
          uVar16 = (ulong)(uVar14 & 1) << 0x3d;
          uVar11 = uVar12 | uVar9 & 0xc0000000c0000000 | uVar11;
        }
        else {
          pGVar8 = p_00->pObjs;
          if ((pGVar7 < pGVar8) || (pGVar8 + iVar4 <= pGVar7)) goto LAB_00506f99;
          uVar12 = (ulong)(((uint)(iVar13 - (int)pGVar8) >> 2) * -0x55555555 - uVar10 & 0x1fffffff)
                   << 0x20;
          uVar9 = *(ulong *)pGVar7;
          uVar17 = (ulong)(uVar19 & 1) << 0x3d;
          *(ulong *)pGVar7 = uVar17 | uVar9 & 0xc0000000ffffffff | uVar12;
          pGVar8 = p_00->pObjs;
          if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_00506f99;
          uVar11 = (ulong)(((uint)(iVar13 - (int)pGVar8) >> 2) * -0x55555555 - uVar3 & 0x1fffffff);
          *(ulong *)pGVar7 = uVar17 | uVar9 & 0xc0000000e0000000 | uVar12 | uVar11;
          uVar16 = (ulong)((uVar14 & 1) << 0x1d);
          uVar11 = uVar17 | uVar9 & 0xc0000000c0000000 | uVar12 | uVar11;
        }
        *(ulong *)pGVar7 = uVar11 | uVar16;
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar7 + -(uVar11 & 0x1fffffff),pGVar7);
          Gia_ObjAddFanout(p_00,pGVar7 + -((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff),pGVar7);
        }
        if (p_00->fSweeper != 0) {
          uVar12 = *(ulong *)pGVar7 & 0x1fffffff;
          uVar9 = *(ulong *)pGVar7 >> 0x20 & 0x1fffffff;
          uVar17 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar7 + -uVar12) >> 0x1e & 1) == 0) {
            uVar17 = 0x40000000;
          }
          *(ulong *)(pGVar7 + -uVar12) = uVar17 | *(ulong *)(pGVar7 + -uVar12);
          uVar17 = *(ulong *)(pGVar7 + -uVar9);
          uVar11 = 0x4000000000000000;
          if (((uint)uVar17 >> 0x1e & 1) == 0) {
            uVar11 = 0x40000000;
          }
          *(ulong *)(pGVar7 + -uVar9) = uVar11 | uVar17;
          uVar9 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 =
               uVar9 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar9 >> 0x3d) ^ (uint)(uVar17 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar7 + -uVar12) >> 0x3f) ^
                      (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
        }
        pGVar8 = p_00->pObjs;
        if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_00506f99;
        *(int *)(&pGVar2->field_0x0 + lVar15) =
             (int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * 0x55555556;
      }
      lVar18 = lVar18 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar18 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}